

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array3.h
# Opt level: O2

void __thiscall
Array3<float,_Array1<float>_>::resize(Array3<float,_Array1<float>_> *this,int ni_,int nj_,int nk_)

{
  if (-1 < (nj_ | ni_ | nk_)) {
    Array1<float>::resize(&this->a,(ulong)(uint)(nj_ * ni_ * nk_));
    this->ni = ni_;
    this->nj = nj_;
    this->nk = nk_;
    return;
  }
  __assert_fail("ni_>=0 && nj_>=0 && nk_>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/alecjacobson[P]SDFGen/array3.h"
                ,0xe1,
                "void Array3<float, Array1<float>>::resize(int, int, int) [T = float, ArrayT = Array1<float>]"
               );
}

Assistant:

void resize(int ni_, int nj_, int nk_)
   {
      assert(ni_>=0 && nj_>=0 && nk_>=0);
      a.resize(ni_*nj_*nk_);
      ni=ni_;
      nj=nj_;
      nk=nk_;
   }